

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.c
# Opt level: O3

void lws_server_get_canonical_hostname(lws_context *context,lws_context_creation_info *info)

{
  int iVar1;
  lws_log_cx *cx;
  
  if ((info->options & 4) == 0) {
    iVar1 = gethostname(context->canonical_hostname,0x5f);
    if (iVar1 != 0) {
      lws_strncpy(context->canonical_hostname,"unknown",0x60);
    }
    cx = lwsl_context_get_cx(context);
    _lws_log_cx(cx,lws_log_prepend_context,context,8,"lws_server_get_canonical_hostname",
                " canonical_hostname = %s\n",context);
  }
  return;
}

Assistant:

void
lws_server_get_canonical_hostname(struct lws_context *context,
				  const struct lws_context_creation_info *info)
{
	if (lws_check_opt(info->options,
			LWS_SERVER_OPTION_SKIP_SERVER_CANONICAL_NAME))
		return;
#if !defined(LWS_PLAT_FREERTOS)
	/* find canonical hostname */
	if (gethostname((char *)context->canonical_hostname,
		        sizeof(context->canonical_hostname) - 1))
		lws_strncpy((char *)context->canonical_hostname, "unknown",
			    sizeof(context->canonical_hostname));

	lwsl_cx_info(context, " canonical_hostname = %s\n",
					context->canonical_hostname);
#else
	(void)context;
#endif
}